

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_upto_test(bool multi_kv)

{
  void *__s1;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  fdb_kvs_handle **ptr_handle;
  uint uVar7;
  long lVar8;
  undefined7 in_register_00000039;
  fdb_snapshot_info_t *pfVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  fdb_snapshot_info_t *markers;
  fdb_file_handle *dbfile;
  uint64_t num_markers;
  int local_56c;
  ulong local_568;
  long local_560;
  fdb_kvs_handle *snapshot;
  char kv_name [8];
  fdb_kvs_handle *local_548 [5];
  ulong local_520;
  long local_518;
  fdb_kvs_config kvs_config;
  char compact_filename [32];
  timeval __test_begin;
  fdb_doc *local_4c8 [20];
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.block_reusing_threshold = 0;
  fconfig.multi_kv_instances = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_open(&dbfile,"./compact_test1",&fconfig);
  local_56c = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_56c == 0) {
    fdb_kvs_open_default(dbfile,local_548,&kvs_config);
    uVar7 = 1;
  }
  else {
    ptr_handle = local_548;
    uVar7 = 4;
    for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
      sprintf(kv_name,"kv%d",uVar10 & 0xffffffff);
      fdb_kvs_open(dbfile,ptr_handle,kv_name,&kvs_config);
      ptr_handle = ptr_handle + 1;
    }
  }
  uVar10 = (ulong)uVar7;
  for (uVar11 = 0; uVar11 != 5; uVar11 = uVar11 + 1) {
    sprintf(keybuf,"key%d",uVar11 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar11 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar11 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar11,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      fdb_set(local_548[uVar12],local_4c8[uVar11]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar11 = 5; uVar11 != 10; uVar11 = uVar11 + 1) {
    sprintf(keybuf,"key%d",uVar11 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar11 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar11 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar11,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      fdb_set(local_548[uVar12],local_4c8[uVar11]);
    }
  }
  fdb_commit(dbfile,'\0');
  for (uVar11 = 10; uVar11 != 0xf; uVar11 = uVar11 + 1) {
    sprintf(keybuf,"key%d",uVar11 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar11 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar11 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar11,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      fdb_set(local_548[uVar12],local_4c8[uVar11]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar11 = 0xf; uVar11 != 0x14; uVar11 = uVar11 + 1) {
    sprintf(keybuf,"key%d",uVar11 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar11 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar11 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar11,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      fdb_set(local_548[uVar12],local_4c8[uVar11]);
    }
  }
  uVar11 = 0;
  fdb_commit(dbfile,'\0');
  while (uVar10 != uVar11) {
    fVar1 = fdb_set_log_callback(local_548[uVar11],logCallbackFunc,"compact_upto_test");
    uVar11 = uVar11 + 1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x3f5);
      compact_upto_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x3f5,"void compact_upto_test(bool)");
    }
  }
  fVar1 = fdb_get_all_snap_markers(dbfile,&markers,&num_markers);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x3f9);
    compact_upto_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x3f9,"void compact_upto_test(bool)");
  }
  if ((char)local_56c == '\0') {
    if (num_markers != 4) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x3fc);
      compact_upto_test(bool)::__test_pass = '\x01';
      if (num_markers != 4) {
        __assert_fail("num_markers == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x3fc,"void compact_upto_test(bool)");
      }
    }
    lVar13 = 0x1400000000;
    lVar8 = 0;
    uVar10 = 4;
    for (uVar11 = 0; uVar11 < uVar10; uVar11 = uVar11 + 1) {
      if (*(long *)((long)&markers->num_kvs_markers + lVar8) != 1) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x3fe);
        compact_upto_test(bool)::__test_pass = '\x01';
        if (*(long *)((long)&markers->num_kvs_markers + lVar8) != 1) {
          __assert_fail("markers[r].num_kvs_markers == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x3fe,"void compact_upto_test(bool)");
        }
      }
      if (*(long *)(*(long *)((long)&markers->kvs_markers + lVar8) + 8) != lVar13 >> 0x20) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x400);
        compact_upto_test(bool)::__test_pass = '\x01';
        if (*(long *)(*(long *)((long)&markers->kvs_markers + lVar8) + 8) != lVar13 >> 0x20) {
          __assert_fail("markers[r].kvs_markers[0].seqnum == (fdb_seqnum_t)(n - r*5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x400,"void compact_upto_test(bool)");
        }
      }
      lVar13 = lVar13 + -0x500000000;
      lVar8 = lVar8 + 0x18;
      uVar10 = num_markers;
    }
    sprintf(compact_filename,"compact_test_compact%d",1);
    fVar1 = fdb_compact_upto(dbfile,compact_filename,markers[1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x406);
      compact_upto_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x406,"void compact_upto_test(bool)");
    }
    fVar1 = fdb_snapshot_open(local_548[0],&snapshot,(markers[1].kvs_markers)->seqnum);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x40a);
      compact_upto_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x40a,"void compact_upto_test(bool)");
    }
  }
  else {
    if (num_markers != 8) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x40e);
      compact_upto_test(bool)::__test_pass = '\x01';
      if (num_markers != 8) {
        __assert_fail("num_markers == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x40e,"void compact_upto_test(bool)");
      }
    }
    local_568 = (ulong)(uVar7 + 1);
    uVar11 = 0;
    while (uVar11 != uVar10) {
      if (markers[uVar11].num_kvs_markers != local_568) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x410);
        compact_upto_test(bool)::__test_pass = '\x01';
        if (markers[uVar11].num_kvs_markers != local_568) {
          __assert_fail("markers[r].num_kvs_markers == num_kvs+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x410,"void compact_upto_test(bool)");
        }
      }
      local_560 = uVar11 * -5 + 0x14;
      lVar13 = 0;
      uVar12 = 0;
      pfVar9 = markers;
      local_520 = uVar11;
      local_518 = uVar11 * 0x18;
      while (lVar8 = local_518, uVar10 != uVar12) {
        if (*(long *)(*(long *)((long)&pfVar9->kvs_markers + local_518) + 8 + lVar13) != local_560)
        {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x413);
          compact_upto_test(bool)::__test_pass = '\x01';
          if (*(long *)(*(long *)((long)&markers->kvs_markers + lVar8) + 8 + lVar13) != local_560) {
            __assert_fail("markers[r].kvs_markers[i].seqnum == (fdb_seqnum_t)(n - r*5)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x413,"void compact_upto_test(bool)");
          }
        }
        sprintf(kv_name,"kv%d",uVar12 & 0xffffffff);
        pfVar9 = markers;
        __s1 = *(void **)(*(long *)((long)&markers->kvs_markers + lVar8) + lVar13);
        iVar2 = bcmp(__s1,kv_name,3);
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x10;
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",kv_name,__s1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x415);
          compact_upto_test(bool)::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x415,"void compact_upto_test(bool)");
        }
      }
      uVar11 = local_520 + 1;
    }
    sprintf(compact_filename,"compact_test_compact%d",1);
    fVar1 = fdb_compact_upto(dbfile,compact_filename,markers[1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x41c);
      compact_upto_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x41c,"void compact_upto_test(bool)");
    }
    fVar1 = fdb_snapshot_open(local_548[1],&snapshot,markers[1].kvs_markers[1].seqnum);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x420);
      compact_upto_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x420,"void compact_upto_test(bool)");
    }
  }
  fdb_kvs_close(snapshot);
  fVar1 = fdb_free_snap_markers(markers,num_markers);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_close(dbfile);
    for (lVar13 = 0; lVar13 != 0x14; lVar13 = lVar13 + 1) {
      fdb_doc_free(local_4c8[lVar13]);
    }
    fdb_shutdown();
    memleak_end();
    pcVar6 = "single kv mode:";
    if ((char)local_56c != '\0') {
      pcVar6 = "multiple kv mode:";
    }
    sprintf(bodybuf,"compact upto marker in file test %s",pcVar6);
    pcVar6 = "%s PASSED\n";
    if (compact_upto_test(bool)::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar6,bodybuf);
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x426);
  compact_upto_test(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x426,"void compact_upto_test(bool)");
}

Assistant:

void compact_upto_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    fdb_kvs_handle *snapshot;
    uint64_t num_markers;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];
    char compact_filename[32];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    // since this test requires static number of markers,
    // disable block reusing
    fconfig.block_reusing_threshold = 0;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "compact_upto_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (!multi_kv) {
        TEST_CHK(num_markers == 4);
        for (r = 0; (uint64_t)r < num_markers; ++r) {
            TEST_CHK(markers[r].num_kvs_markers == 1);
            TEST_CHK(markers[r].kvs_markers[0].seqnum ==
                     (fdb_seqnum_t)(n - r*5));
        }
        r = 1; // Test compacting upto sequence number 15
        sprintf(compact_filename, "compact_test_compact%d", r);
        status = fdb_compact_upto(dbfile, compact_filename,
                                  markers[r].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // create a snapshot
        status = fdb_snapshot_open(db[0], &snapshot,
                                   markers[r].kvs_markers[0].seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // close snapshot
        fdb_kvs_close(snapshot);
    } else {
        TEST_CHK(num_markers == 8);
        for (r = 0; r < num_kvs; ++r) {
            TEST_CHK(markers[r].num_kvs_markers == num_kvs+1);
            for (i = 0; i < num_kvs; ++i) {
                TEST_CHK(markers[r].kvs_markers[i].seqnum
                         == (fdb_seqnum_t)(n - r*5));
                sprintf(kv_name, "kv%d", i);
                TEST_CMP(markers[r].kvs_markers[i].kv_store_name, kv_name, 3);
            }
        }
        i = r = 1;
        sprintf(compact_filename, "compact_test_compact%d", i);
        status = fdb_compact_upto(dbfile, compact_filename,
                markers[i].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // create a snapshot
        status = fdb_snapshot_open(db[r], &snapshot,
                markers[i].kvs_markers[r].seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // close snapshot
        fdb_kvs_close(snapshot);
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "compact upto marker in file test %s", multi_kv ?
                                                           "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}